

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rco.cpp
# Opt level: O1

void __thiscall RCO::RCO(RCO *this,uint8_t *buffer,uint32_t bufferLen)

{
  this->mBuffer = buffer;
  this->mBufferLen = bufferLen;
  this->mVerbose = true;
  this->mIsRCSF = false;
  this->mRCOErrno = 0;
  (this->mRootElement).name._M_dataplus._M_p = (pointer)&(this->mRootElement).name.field_2;
  (this->mRootElement).name._M_string_length = 0;
  (this->mRootElement).name.field_2._M_local_buf[0] = '\0';
  (this->mRootElement).originalSize = 0;
  (this->mRootElement).attributes.super__Vector_base<RCOAttribute,_std::allocator<RCOAttribute>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mRootElement).attributes.super__Vector_base<RCOAttribute,_std::allocator<RCOAttribute>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mRootElement).attributes.super__Vector_base<RCOAttribute,_std::allocator<RCOAttribute>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mRootElement).siblings.super__Vector_base<RCOElement,_std::allocator<RCOElement>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mRootElement).siblings.super__Vector_base<RCOElement,_std::allocator<RCOElement>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mRootElement).siblings.super__Vector_base<RCOElement,_std::allocator<RCOElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mRootElement).children.super__Vector_base<RCOElement,_std::allocator<RCOElement>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mRootElement).children.super__Vector_base<RCOElement,_std::allocator<RCOElement>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->mRootElement).children.super__Vector_base<RCOElement,_std::allocator<RCOElement>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->mRootElement).children.super__Vector_base<RCOElement,_std::allocator<RCOElement>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (this->mElements)._M_h._M_buckets = &(this->mElements)._M_h._M_single_bucket;
  (this->mElements)._M_h._M_bucket_count = 1;
  (this->mElements)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->mElements)._M_h._M_element_count = 0;
  (this->mElements)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->mElements)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->mElements)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->mFiles)._M_h._M_buckets = &(this->mFiles)._M_h._M_single_bucket;
  (this->mFiles)._M_h._M_bucket_count = 1;
  (this->mFiles)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->mFiles)._M_h._M_element_count = 0;
  (this->mFiles)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->mFiles)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->mFiles)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->mStringTable)._M_h._M_buckets = &(this->mStringTable)._M_h._M_single_bucket;
  (this->mStringTable)._M_h._M_bucket_count = 1;
  (this->mStringTable)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->mStringTable)._M_h._M_element_count = 0;
  (this->mStringTable)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->mStringTable)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->mStringTable)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  memcpy(&this->mHeader,buffer,0x50);
  this->mRCOErrno = 0;
  loadElement(this,&this->mRootElement,(this->mHeader).tree_start_off);
  this->mRCOErrno = 0;
  return;
}

Assistant:

RCO::RCO(uint8_t *buffer, uint32_t bufferLen) : mBuffer(buffer), mBufferLen(bufferLen)
{
	mRCOErrno = loadHeader();
	if (mRCOErrno != NO_ERROR)
		return;

	mRCOErrno = loadElement(mRootElement, mHeader.tree_start_off);

	if (mRCOErrno != NO_ERROR)
		printf("Error!\n");
}